

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void set_grain_syn_params(AV1_COMMON *cm)

{
  int iVar1;
  long in_RDI;
  aom_film_grain_t *film_grain_params;
  
  *(undefined4 *)(in_RDI + 0x5cc8) = 1;
  *(undefined4 *)(in_RDI + 0x5ccc) = 1;
  iVar1 = rand();
  *(short *)(in_RDI + 0x5f4c) = (short)iVar1;
  *(undefined4 *)(in_RDI + 0x5d40) = 1;
  *(undefined4 *)(in_RDI + 0x5cd0) = 0x80;
  *(undefined4 *)(in_RDI + 0x5cd4) = 100;
  if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x4d) == '\0') {
    *(undefined4 *)(in_RDI + 0x5d94) = 1;
    *(undefined4 *)(in_RDI + 0x5d44) = 0x80;
    *(undefined4 *)(in_RDI + 0x5d48) = 100;
    *(undefined4 *)(in_RDI + 0x5de8) = 1;
    *(undefined4 *)(in_RDI + 0x5d98) = 0x80;
    *(undefined4 *)(in_RDI + 0x5d9c) = 100;
  }
  else {
    *(undefined4 *)(in_RDI + 0x5d94) = 0;
    *(undefined4 *)(in_RDI + 0x5de8) = 0;
  }
  *(undefined4 *)(in_RDI + 0x5f44) = 0;
  *(undefined4 *)(in_RDI + 0x5dec) = 1;
  *(undefined4 *)(in_RDI + 0x5df0) = 0;
  *(undefined4 *)(in_RDI + 0x5f1c) = 1;
  *(undefined4 *)(in_RDI + 0x5f38) = 1;
  *(undefined4 *)(in_RDI + 0x5f48) = 0;
  return;
}

Assistant:

static void set_grain_syn_params(AV1_COMMON *cm) {
  aom_film_grain_t *film_grain_params = &cm->film_grain_params;
  film_grain_params->apply_grain = 1;
  film_grain_params->update_parameters = 1;
  film_grain_params->random_seed = rand() & 0xffff;

  film_grain_params->num_y_points = 1;
  film_grain_params->scaling_points_y[0][0] = 128;
  film_grain_params->scaling_points_y[0][1] = 100;

  if (!cm->seq_params->monochrome) {
    film_grain_params->num_cb_points = 1;
    film_grain_params->scaling_points_cb[0][0] = 128;
    film_grain_params->scaling_points_cb[0][1] = 100;

    film_grain_params->num_cr_points = 1;
    film_grain_params->scaling_points_cr[0][0] = 128;
    film_grain_params->scaling_points_cr[0][1] = 100;
  } else {
    film_grain_params->num_cb_points = 0;
    film_grain_params->num_cr_points = 0;
  }

  film_grain_params->chroma_scaling_from_luma = 0;

  film_grain_params->scaling_shift = 1;
  film_grain_params->ar_coeff_lag = 0;
  film_grain_params->ar_coeff_shift = 1;
  film_grain_params->overlap_flag = 1;
  film_grain_params->grain_scale_shift = 0;
}